

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitArrayInitData(PrintExpressionContents *this,ArrayInitData *curr)

{
  ostream *stream;
  undefined8 in_RAX;
  HeapType type;
  undefined8 uStack_28;
  
  stream = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"array.init_data ",0x10);
  Colors::outputColorCode(stream,"\x1b[0m");
  type = wasm::Type::getHeapType(&curr->ref->type);
  PrintSExpression::printHeapTypeName(this->parent,type);
  uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
  Name::print(&curr->segment,this->o);
  return;
}

Assistant:

void visitArrayInitData(ArrayInitData* curr) {
    printMedium(o, "array.init_data ");
    printHeapTypeName(curr->ref->type.getHeapType());
    o << ' ';
    curr->segment.print(o);
  }